

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O2

void __thiscall APITests::test_setup_twice(APITests *this)

{
  int iVar1;
  allocator local_39;
  string local_38;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  iVar1 = GPIO::input((this->pin_data).in_a);
  std::__cxx11::string::string((string *)&local_38,"",&local_39);
  assert::is_true(iVar1 == 1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_twice()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);

        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        auto val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::cleanup();
    }